

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::fastresume_rejected_alert::~fastresume_rejected_alert(fastresume_rejected_alert *this)

{
  fastresume_rejected_alert *this_local;
  
  ~fastresume_rejected_alert(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT fastresume_rejected_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT fastresume_rejected_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, error_code const& ec, string_view file
			, operation_t op);

		TORRENT_DEFINE_ALERT_PRIO(fastresume_rejected_alert, 53, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::status
			| alert_category::error;
		std::string message() const override;

		error_code error;

		// If the error happened to a specific file, this returns the path to it.
		char const* file_path() const;

		// the underlying operation that failed
		operation_t op;

	private:
		aux::allocation_slot m_path_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// If the error happened in a disk operation. a 0-terminated string of
		// the name of that operation. ``operation`` is nullptr otherwise.
		TORRENT_DEPRECATED char const* operation;

		// If the error happened to a specific file, ``file`` is the path to it.
		TORRENT_DEPRECATED std::string file;
		TORRENT_DEPRECATED std::string msg;
#endif
	}